

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_> __thiscall
pegmatite::parse(pegmatite *this,Input *input,Rule *g,Rule *ws,ErrorReporter *err,ParserDelegate *d)

{
  FILE *__stream;
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  pointer pAVar4;
  char *pcVar5;
  reference pvVar6;
  ASTNode *val;
  pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>
  *I;
  iterator __end2;
  iterator __begin2;
  ASTStack *__range2;
  int i;
  undefined1 local_50 [8];
  ASTStack st;
  ParserDelegate *d_local;
  ErrorReporter *err_local;
  Rule *ws_local;
  Rule *g_local;
  Input *input_local;
  
  st.
  super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)d;
  std::
  vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ::vector((vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
            *)local_50);
  bVar1 = parse(input,g,ws,err,
                (ParserDelegate *)
                st.
                super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                 *)local_50);
  if (bVar1) {
    sVar2 = std::
            vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
            ::size((vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                    *)local_50);
    if (1 < sVar2) {
      __range2._4_4_ = 0;
      __end2 = std::
               vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
               ::begin((vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                        *)local_50);
      I = (pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>
           *)std::
             vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
             ::end((vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                    *)local_50);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_*,_std::vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>_>
                                         *)&I), bVar1) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_*,_std::vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>_>
                 ::operator*(&__end2);
        pAVar4 = std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>::get
                           (&ppVar3->second);
        __stream = _stderr;
        if (pAVar4 == (pointer)0x0) {
          __cxa_bad_typeid();
        }
        pcVar5 = std::type_info::name((type_info *)pAVar4->_vptr_ASTNode[-1]);
        fprintf(__stream,"[%d] %s\n",(ulong)__range2._4_4_,pcVar5);
        __gnu_cxx::
        __normal_iterator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_*,_std::vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>_>
        ::operator++(&__end2);
        __range2._4_4_ = __range2._4_4_ + 1;
      }
    }
    sVar2 = std::
            vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
            ::size((vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                    *)local_50);
    if (sVar2 != 1) {
      __assert_fail("st.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/plietar[P]Pegmatite/ast.cc"
                    ,0xaa,
                    "std::unique_ptr<ASTNode> pegmatite::parse(Input &, const Rule &, const Rule &, ErrorReporter &, const ParserDelegate &)"
                   );
    }
    pvVar6 = std::
             vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
             ::operator[]((vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                           *)local_50,0);
    std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>::unique_ptr
              ((unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_> *)this,
               &pvVar6->second);
  }
  else {
    std::unique_ptr<pegmatite::ASTNode,std::default_delete<pegmatite::ASTNode>>::
    unique_ptr<std::default_delete<pegmatite::ASTNode>,void>
              ((unique_ptr<pegmatite::ASTNode,std::default_delete<pegmatite::ASTNode>> *)this,
               (nullptr_t)0x0);
  }
  std::
  vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ::~vector((vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
             *)local_50);
  return (__uniq_ptr_data<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>,_true,_true>)
         (__uniq_ptr_data<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ASTNode> parse(Input &input, const Rule &g, const Rule &ws,
                               ErrorReporter &err, const ParserDelegate &d)
{
	ASTStack st;
	if (!parse(input, g, ws, err, d, &st)) return nullptr;
	if (st.size() > 1)
	{
		int i = 0;
		for (auto &I : st)
		{
			auto *val = I.second.get();
			fprintf(stderr, "[%d] %s\n", i++, typeid(*val).name());
		}
	}
	assert(st.size() == 1);
	return std::move(st[0].second);
}